

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,Connection *c)

{
  Expression *pEVar1;
  Connection *c_local;
  ASTVisitor *this_local;
  
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)c->source);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)c->dest);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&c->delayLength);
  return;
}

Assistant:

virtual void visit (AST::Connection& c)
    {
        visitObject (c.source.endpoint);
        visitObject (c.dest.endpoint);
        visitObjectIfNotNull (c.delayLength);
    }